

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,VectorBase<double> *x,VectorBase<double> *b)

{
  (*this->solveTime->_vptr_Timer[3])();
  VectorBase<double>::operator=(&this->vec,b);
  VectorBase<double>::clear(x);
  CLUFactor<double>::solveLeft
            (&this->super_CLUFactor<double>,
             (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(VectorBase<R>& x, const VectorBase<R>& b) //const
{

   solveTime->start();

   vec = b;
   x.clear();
   CLUFactor<R>::solveLeft(x.get_ptr(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}